

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  undefined8 *puVar1;
  NetPrivate *pNVar2;
  pointer pMVar3;
  int *piVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  void *pvVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  pointer piVar16;
  Option *pOVar17;
  pointer piVar18;
  NetPrivate *pNVar19;
  NetPrivate *pNVar20;
  NetPrivate *__ptr;
  pointer pMVar21;
  long lVar22;
  ulong uVar23;
  pointer pcVar24;
  bool bVar25;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type local_d9;
  Mat local_d8;
  NetPrivate *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  NetPrivate *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int local_50;
  pointer local_48;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    pNVar19 = (NetPrivate *)&stack0xffffffffffffff78;
    pOVar17 = opt;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pNVar19,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_d8);
    piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_38 = (pointer)blob_mats;
    if ((layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar16) {
      lVar22 = 0;
      uVar23 = 0;
      do {
        pNVar2 = local_88;
        iVar13 = (int)pOVar17;
        pMVar21 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_38->name)->_M_impl
                  ).super__Vector_impl_data._M_start + piVar16[uVar23];
        piVar15 = *(int **)((long)&(local_88->blobs).
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar22);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            pNVar20 = *(NetPrivate **)((long)&local_88->opt + lVar22);
            pNVar19 = *(NetPrivate **)
                       ((long)&(local_88->layers).
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar22);
            if (pNVar19 == (NetPrivate *)0x0) {
              if (pNVar20 != (NetPrivate *)0x0) {
                free(pNVar20);
                pNVar19 = pNVar20;
              }
            }
            else {
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
            }
          }
        }
        puVar1 = (undefined8 *)((long)&pNVar2->opt + lVar22);
        *(undefined8 *)
         ((long)&(pNVar2->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + lVar22) = 0;
        *(undefined8 *)((long)puVar1 + 0xc) = 0;
        *(undefined8 *)((long)puVar1 + 0x14) = 0;
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)
                 ((long)&(pNVar2->layers).
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar22);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)
         ((long)&(pNVar2->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar22) = 0;
        if (((opt->lightmode == true) && (layer->support_inplace == true)) &&
           (*pMVar21->refcount != 1)) {
          pNVar19 = (NetPrivate *)&local_d8;
          Mat::clone(&local_d8,(__fn *)pMVar21,opt->blob_allocator,iVar13,opt);
          pNVar20 = local_88;
          pNVar2 = (NetPrivate *)((long)&local_88->opt + lVar22);
          piVar15 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (pNVar2 != (NetPrivate *)&local_d8) {
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + 1;
              UNLOCK();
            }
            piVar15 = *(int **)((long)&(local_88->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar22);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                __ptr = *(NetPrivate **)((long)&local_88->opt + lVar22);
                pNVar19 = *(NetPrivate **)
                           ((long)&(local_88->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar22);
                if (pNVar19 == (NetPrivate *)0x0) {
                  if (__ptr != (NetPrivate *)0x0) {
                    free(__ptr);
                    pNVar19 = __ptr;
                  }
                }
                else {
                  (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 &pNVar19->opt)->_M_impl).super__Vector_impl_data._M_start)->
                               elempack)();
                }
              }
            }
            *(undefined8 *)
             ((long)&(pNVar20->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar22) = 0;
            *(undefined8 *)
             ((long)&(pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_start + 4) = 0;
            *(undefined8 *)
             ((long)&(pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
            pNVar2->opt = (Option *)0x0;
            (pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            puVar1 = (undefined8 *)
                     ((long)&(pNVar20->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar22);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)
             ((long)&(pNVar20->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar22) = 0;
            *(void **)((long)&pNVar20->opt + lVar22) = local_d8.data;
            piVar15 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            *(int **)((long)&(pNVar20->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar22) = piVar15;
            *(ulong *)((long)&(pNVar20->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_finish + lVar22) =
                 CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
            *(int *)((long)&(pNVar20->blobs).
                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + lVar22) = local_d8.elempack;
            *(Allocator **)
             ((long)&(pNVar20->layers).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar22) = local_d8.allocator;
            piVar4 = (int *)((long)&(pNVar20->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar22);
            *piVar4 = local_d8.dims;
            piVar4[1] = local_d8.w;
            piVar4[2] = local_d8.h;
            piVar4[3] = local_d8.d;
            *(int *)((long)&(pNVar20->input_blob_indexes).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar22) = local_d8.c;
            *(size_t *)
             ((long)&(pNVar20->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar22) = local_d8.cstep;
          }
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + -1;
            UNLOCK();
            if (*piVar15 == 0) {
              pNVar19 = (NetPrivate *)local_d8.allocator;
              if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
                if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
                  pNVar19 = (NetPrivate *)local_d8.data;
                  free(local_d8.data);
                }
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                               &(local_d8.allocator)->_vptr_Allocator)->_M_impl).
                              super__Vector_impl_data._M_start)->elempack)();
              }
            }
          }
        }
        pNVar2 = local_88;
        if ((*(int *)((long)&(local_88->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar22) == 0) &&
           (pMVar3 = (pointer)((long)&local_88->opt + lVar22), pMVar3 != pMVar21)) {
          piVar15 = pMVar21->refcount;
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + 1;
            UNLOCK();
          }
          piVar15 = *(int **)((long)&(local_88->blobs).
                                     super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar22);
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + -1;
            UNLOCK();
            if (*piVar15 == 0) {
              pNVar20 = *(NetPrivate **)((long)&local_88->opt + lVar22);
              pNVar19 = *(NetPrivate **)
                         ((long)&(local_88->layers).
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar22);
              if (pNVar19 == (NetPrivate *)0x0) {
                if (pNVar20 != (NetPrivate *)0x0) {
                  free(pNVar20);
                  pNVar19 = pNVar20;
                }
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt
                               )->_M_impl).super__Vector_impl_data._M_start)->elempack)();
              }
            }
          }
          puVar1 = (undefined8 *)((long)&pNVar2->opt + lVar22);
          puVar1[8] = 0;
          *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
          pMVar3->data = (void *)0x0;
          pMVar3->refcount = (int *)0x0;
          puVar1[5] = 0;
          puVar1[6] = 0;
          *(undefined4 *)(puVar1 + 7) = 0;
          piVar15 = pMVar21->refcount;
          *puVar1 = pMVar21->data;
          puVar1[1] = piVar15;
          puVar1[2] = pMVar21->elemsize;
          *(int *)(puVar1 + 3) = pMVar21->elempack;
          puVar1[4] = pMVar21->allocator;
          uVar6 = *(undefined8 *)&pMVar21->h;
          puVar1[5] = *(undefined8 *)&pMVar21->dims;
          puVar1[6] = uVar6;
          *(int *)(puVar1 + 7) = pMVar21->c;
          puVar1[8] = pMVar21->cstep;
        }
        convert_layout(pNVar19,(Mat *)((long)&local_88->opt + lVar22),layer,opt);
        uVar23 = uVar23 + 1;
        piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pOVar17 = (Option *)
                  ((long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar16 >> 2);
        lVar22 = lVar22 + 0x48;
      } while (uVar23 < pOVar17);
    }
    pcVar24 = local_38;
    if ((opt->lightmode == false) || (layer->support_inplace != true)) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8,
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_d9);
      iVar13 = (*layer->_vptr_Layer[6])(layer,&stack0xffffffffffffff78,&local_d8,opt);
      if (iVar13 != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
        goto LAB_00163d02;
      }
      piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar18 != piVar16) {
        lVar22 = 0;
        uVar23 = 0;
        do {
          pvVar12 = local_d8.data;
          pMVar21 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar24->name)->
                    _M_impl).super__Vector_impl_data._M_start + piVar16[uVar23];
          if ((pointer)((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                local_d8.data)->_M_impl).super__Vector_impl_data._M_start + lVar22)
              != pMVar21) {
            piVar15 = *(int **)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                        ((long)local_d8.data + 8))->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start + lVar22);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + 1;
              UNLOCK();
            }
            piVar15 = pMVar21->refcount;
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                if (pMVar21->allocator == (Allocator *)0x0) {
                  if (pMVar21->data != (void *)0x0) {
                    free(pMVar21->data);
                  }
                }
                else {
                  (*pMVar21->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar21->cstep = 0;
            pMVar21->data = (void *)0x0;
            pMVar21->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
            pMVar21->dims = 0;
            pMVar21->w = 0;
            pMVar21->h = 0;
            pMVar21->d = 0;
            pMVar21->c = 0;
            puVar1 = (undefined8 *)
                     ((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar12)->
                             _M_impl).super__Vector_impl_data._M_start + lVar22);
            piVar15 = (int *)puVar1[1];
            pMVar21->data = (void *)*puVar1;
            pMVar21->refcount = piVar15;
            pMVar21->elemsize =
                 *(size_t *)
                  ((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)((long)pvVar12 + 8))
                          ->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
            pMVar21->elempack =
                 *(int *)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                  ((long)pvVar12 + 8))->
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar22);
            pMVar21->allocator =
                 *(Allocator **)
                  ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                           ((long)pvVar12 + 0x20))->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar22);
            puVar1 = (undefined8 *)
                     ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                              ((long)pvVar12 + 0x20))->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish + lVar22);
            uVar6 = *puVar1;
            uVar7 = puVar1[1];
            pMVar21->dims = (int)uVar6;
            pMVar21->w = (int)((ulong)uVar6 >> 0x20);
            pMVar21->h = (int)uVar7;
            pMVar21->d = (int)((ulong)uVar7 >> 0x20);
            pMVar21->c = *(int *)((long)&(((vector<int,_std::allocator<int>_> *)
                                          ((long)pvVar12 + 0x38))->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + lVar22);
            pMVar21->cstep =
                 *(size_t *)
                  ((long)&(((vector<int,_std::allocator<int>_> *)((long)pvVar12 + 0x38))->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
            piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar23 = uVar23 + 1;
          lVar22 = lVar22 + 0x48;
        } while (uVar23 < (ulong)((long)piVar18 - (long)piVar16 >> 2));
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
    }
    else {
      iVar13 = (*layer->_vptr_Layer[8])(layer,&stack0xffffffffffffff78,opt);
      if (iVar13 != 0) {
LAB_00163d02:
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff78);
        return iVar13;
      }
      piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar18 != piVar16) {
        lVar22 = 0;
        uVar23 = 0;
        do {
          pNVar19 = local_88;
          pMVar21 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar24->name)->
                    _M_impl).super__Vector_impl_data._M_start + piVar16[uVar23];
          if ((pointer)((long)&local_88->opt + lVar22) != pMVar21) {
            piVar15 = *(int **)((long)&(local_88->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar22);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + 1;
              UNLOCK();
            }
            piVar15 = pMVar21->refcount;
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                if (pMVar21->allocator == (Allocator *)0x0) {
                  if (pMVar21->data != (void *)0x0) {
                    free(pMVar21->data);
                  }
                }
                else {
                  (*pMVar21->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar21->cstep = 0;
            pMVar21->data = (void *)0x0;
            pMVar21->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
            pMVar21->dims = 0;
            pMVar21->w = 0;
            pMVar21->h = 0;
            pMVar21->d = 0;
            pMVar21->c = 0;
            puVar1 = (undefined8 *)((long)&pNVar19->opt + lVar22);
            piVar15 = (int *)puVar1[1];
            pMVar21->data = (void *)*puVar1;
            pMVar21->refcount = piVar15;
            pMVar21->elemsize =
                 *(size_t *)
                  ((long)&(pNVar19->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
            pMVar21->elempack =
                 *(int *)((long)&(pNVar19->blobs).
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage + lVar22);
            pMVar21->allocator =
                 *(Allocator **)
                  ((long)&(pNVar19->layers).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar22);
            piVar15 = (int *)((long)&(pNVar19->layers).
                                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + lVar22);
            iVar13 = piVar15[1];
            iVar5 = piVar15[2];
            iVar14 = piVar15[3];
            pMVar21->dims = *piVar15;
            pMVar21->w = iVar13;
            pMVar21->h = iVar5;
            pMVar21->d = iVar14;
            pMVar21->c = *(int *)((long)&(pNVar19->input_blob_indexes).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar22);
            pMVar21->cstep =
                 *(size_t *)
                  ((long)&(pNVar19->input_blob_indexes).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
            piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar23 = uVar23 + 1;
          lVar22 = lVar22 + 0x48;
        } while (uVar23 < (ulong)((long)piVar18 - (long)piVar16 >> 2));
      }
    }
    piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar18 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (piVar18 != piVar16) {
      uVar23 = 0;
      do {
        if (opt->lightmode == true) {
          pMVar21 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar24->name)->
                    _M_impl).super__Vector_impl_data._M_start + piVar16[uVar23];
          piVar15 = pMVar21->refcount;
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + -1;
            UNLOCK();
            if (*piVar15 == 0) {
              if (pMVar21->allocator == (Allocator *)0x0) {
                if (pMVar21->data != (void *)0x0) {
                  free(pMVar21->data);
                }
              }
              else {
                (*pMVar21->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar21->cstep = 0;
          pMVar21->data = (void *)0x0;
          pMVar21->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
          pMVar21->dims = 0;
          pMVar21->w = 0;
          pMVar21->h = 0;
          pMVar21->d = 0;
          pMVar21->c = 0;
          piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar18 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pcVar24 = local_38;
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < (ulong)((long)piVar18 - (long)piVar16 >> 2));
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff78);
    return 0;
  }
  piVar15 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar13 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar5 = *piVar15;
  pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + iVar13;
  local_d8.cstep = 0;
  local_d8.data = (NetPrivate *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar21->refcount != 1)) {
    this = (NetPrivate *)&stack0xffffffffffffff78;
    Mat::clone((Mat *)this,(__fn *)pMVar21,opt->blob_allocator,(int)piVar15,opt);
    piVar15 = (int *)CONCAT44(uStack_7c,uStack_80);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    piVar15 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
          this = (NetPrivate *)local_d8.allocator;
          if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
            free(local_d8.data);
            this = (NetPrivate *)local_d8.data;
          }
        }
        else {
          (**(code **)&((Option *)(local_d8.allocator)->_vptr_Allocator)->openmp_blocktime)();
          this = (NetPrivate *)local_d8.allocator;
        }
      }
    }
    piVar15 = (int *)CONCAT44(uStack_7c,uStack_80);
    local_d8.data = local_88;
    local_d8.refcount._0_4_ = uStack_80;
    local_d8.refcount._4_4_ = uStack_7c;
    local_d8.elemsize._0_4_ = local_78;
    local_d8.elemsize._4_4_ = uStack_74;
    local_d8.elempack = local_70;
    local_d8.allocator = (Allocator *)local_68;
    local_d8.dims = iStack_60;
    local_d8.w = iStack_5c;
    local_d8.h = iStack_58;
    local_d8.d = iStack_54;
    local_d8.c = local_50;
    local_d8.cstep = (size_t)local_48;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        this = local_68;
        if (local_68 == (NetPrivate *)0x0) {
          if (local_88 != (NetPrivate *)0x0) {
            this = local_88;
            free(local_88);
          }
        }
        else {
          (**(code **)&local_68->opt->openmp_blocktime)();
        }
      }
    }
    bVar25 = local_d8.dims != 0;
  }
  else {
    bVar25 = false;
  }
  if ((!bVar25) && (&local_d8 != pMVar21)) {
    piVar15 = pMVar21->refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    piVar15 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
          this = (NetPrivate *)local_d8.allocator;
          if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
            free(local_d8.data);
            this = (NetPrivate *)local_d8.data;
          }
        }
        else {
          (**(code **)&((Option *)(local_d8.allocator)->_vptr_Allocator)->openmp_blocktime)();
          this = (NetPrivate *)local_d8.allocator;
        }
      }
    }
    local_d8.data = pMVar21->data;
    local_d8.refcount._0_4_ = SUB84(pMVar21->refcount,0);
    local_d8.refcount._4_4_ = (undefined4)((ulong)pMVar21->refcount >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)pMVar21->elemsize;
    local_d8.elemsize._4_4_ = (undefined4)(pMVar21->elemsize >> 0x20);
    local_d8.elempack = pMVar21->elempack;
    local_d8.allocator = pMVar21->allocator;
    uVar8 = pMVar21->dims;
    uVar9 = pMVar21->w;
    uVar10 = pMVar21->h;
    uVar11 = pMVar21->d;
    local_d8.c = pMVar21->c;
    local_d8.cstep = pMVar21->cstep;
    local_d8.dims = uVar8;
    local_d8.w = uVar9;
    local_d8.h = uVar10;
    local_d8.d = uVar11;
  }
  convert_layout(this,&local_d8,layer,opt);
  if ((opt->lightmode == true) && (layer->support_inplace == true)) {
    iVar14 = (*layer->_vptr_Layer[9])(layer,&local_d8,opt);
    if (iVar14 == 0) {
      pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar5;
      if (pMVar21 != &local_d8) {
        piVar15 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + 1;
          UNLOCK();
        }
        piVar15 = pMVar21->refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (pMVar21->allocator == (Allocator *)0x0) {
              if (pMVar21->data != (void *)0x0) {
                free(pMVar21->data);
              }
            }
            else {
              (*pMVar21->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar21->cstep = 0;
        pMVar21->data = (void *)0x0;
        pMVar21->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
        pMVar21->dims = 0;
        pMVar21->w = 0;
        pMVar21->h = 0;
        pMVar21->d = 0;
        pMVar21->c = 0;
        pMVar21->data = local_d8.data;
        pMVar21->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        pMVar21->elemsize = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
        pMVar21->elempack = local_d8.elempack;
        pMVar21->allocator = local_d8.allocator;
        pMVar21->dims = local_d8.dims;
        pMVar21->w = local_d8.w;
        pMVar21->h = local_d8.h;
        pMVar21->d = local_d8.d;
        pMVar21->c = local_d8.c;
        pMVar21->cstep = local_d8.cstep;
      }
LAB_001642da:
      iVar14 = 0;
      bVar25 = true;
      if (opt->lightmode == true) {
        pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + iVar13;
        piVar15 = pMVar21->refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (pMVar21->allocator == (Allocator *)0x0) {
              if (pMVar21->data != (void *)0x0) {
                free(pMVar21->data);
              }
            }
            else {
              (*pMVar21->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar21->cstep = 0;
        pMVar21->data = (void *)0x0;
        pMVar21->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
        pMVar21->dims = 0;
        pMVar21->w = 0;
        pMVar21->h = 0;
        pMVar21->d = 0;
        pMVar21->c = 0;
      }
      goto LAB_0016433a;
    }
  }
  else {
    local_48 = (pointer)0x0;
    local_88 = (NetPrivate *)0x0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    local_70 = 0;
    local_68 = (NetPrivate *)0x0;
    iStack_60 = 0;
    iStack_5c = 0;
    iStack_58 = 0;
    _iStack_54 = 0;
    iVar14 = (*layer->_vptr_Layer[7])(layer,&local_d8,(pointer)&stack0xffffffffffffff78);
    if (iVar14 == 0) {
      pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar5;
      piVar15 = (int *)CONCAT44(uStack_7c,uStack_80);
      if (pMVar21 != (pointer)&stack0xffffffffffffff78) {
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + 1;
          UNLOCK();
        }
        piVar15 = pMVar21->refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (pMVar21->allocator == (Allocator *)0x0) {
              if (pMVar21->data != (void *)0x0) {
                free(pMVar21->data);
              }
            }
            else {
              (*pMVar21->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar21->cstep = 0;
        pMVar21->data = (void *)0x0;
        pMVar21->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
        pMVar21->dims = 0;
        pMVar21->w = 0;
        pMVar21->h = 0;
        pMVar21->d = 0;
        pMVar21->c = 0;
        pMVar21->data = local_88;
        piVar15 = (int *)CONCAT44(uStack_7c,uStack_80);
        pMVar21->refcount = piVar15;
        pMVar21->elemsize = CONCAT44(uStack_74,local_78);
        pMVar21->elempack = local_70;
        pMVar21->allocator = (Allocator *)local_68;
        pMVar21->dims = iStack_60;
        pMVar21->w = iStack_5c;
        pMVar21->h = iStack_58;
        pMVar21->d = iStack_54;
        pMVar21->c = local_50;
        pMVar21->cstep = (size_t)local_48;
      }
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_68 == (NetPrivate *)0x0) {
            if (local_88 != (NetPrivate *)0x0) {
              free(local_88);
            }
          }
          else {
            (**(code **)&local_68->opt->openmp_blocktime)();
          }
        }
      }
      goto LAB_001642da;
    }
    piVar15 = (int *)CONCAT44(uStack_7c,uStack_80);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (local_68 == (NetPrivate *)0x0) {
          if (local_88 != (NetPrivate *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)&local_68->opt->openmp_blocktime)();
        }
      }
    }
  }
  bVar25 = false;
LAB_0016433a:
  piVar15 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
        if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (**(code **)&((Option *)(local_d8.allocator)->_vptr_Allocator)->openmp_blocktime)();
      }
    }
  }
  if (bVar25) {
    return 0;
  }
  return iVar14;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}